

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightHandle __thiscall
pbrt::LightHandle::CreateArea
          (LightHandle *this,string *name,ParameterDictionary *parameters,Transform *renderFromLight
          ,MediumInterface *mediumInterface,ShapeHandle *shape,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  uintptr_t iptr;
  DiffuseAreaLight *pDVar2;
  char *fmt;
  uintptr_t local_40;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    local_38.bits =
         (mediumInterface->outside).
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    local_40 = (shape->
               super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
               ).bits;
    pDVar2 = DiffuseAreaLight::Create
                       (renderFromLight,(MediumHandle *)&local_38,parameters,parameters->colorSpace,
                        loc,alloc,(ShapeHandle)&local_40);
    (this->
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    ).bits = (ulong)pDVar2 | 0x6000000000000;
    if (((ulong)pDVar2 & 0xffffffffffff) != 0) {
      ParameterDictionary::ReportUnused(parameters);
      return (LightHandle)
             (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              )this;
    }
    fmt = "%s: unable to create area light.";
  }
  else {
    fmt = "%s: area light type unknown.";
  }
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

LightHandle LightHandle::CreateArea(const std::string &name,
                                    const ParameterDictionary &parameters,
                                    const Transform &renderFromLight,
                                    const MediumInterface &mediumInterface,
                                    const ShapeHandle shape, const FileLoc *loc,
                                    Allocator alloc) {
    LightHandle area = nullptr;
    if (name == "diffuse")
        area =
            DiffuseAreaLight::Create(renderFromLight, mediumInterface.outside, parameters,
                                     parameters.ColorSpace(), loc, alloc, shape);
    else
        ErrorExit(loc, "%s: area light type unknown.", name);

    if (!area)
        ErrorExit(loc, "%s: unable to create area light.", name);

    parameters.ReportUnused();
    return area;
}